

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O1

void __thiscall bssl::SSL_HANDSHAKE::~SSL_HANDSHAKE(SSL_HANDSHAKE *this)

{
  long lVar1;
  
  (*((this->ssl->ctx)._M_t.super___uniq_ptr_impl<ssl_ctx_st,_bssl::internal::Deleter>._M_t.
     super__Tuple_impl<0UL,_ssl_ctx_st_*,_bssl::internal::Deleter>.
     super__Head_base<0UL,_ssl_ctx_st_*,_false>._M_head_impl)->x509_method->hs_flush_cached_ca_names
  )(this);
  std::unique_ptr<bssl::spake2plus::Verifier,_bssl::internal::Deleter>::~unique_ptr
            (&this->pake_verifier);
  std::unique_ptr<bssl::spake2plus::Prover,_bssl::internal::Deleter>::~unique_ptr
            (&this->pake_prover);
  Array<unsigned_char>::~Array(&this->pake_share_bytes);
  std::unique_ptr<bssl::SSLPAKEShare,_bssl::internal::Deleter>::~unique_ptr(&this->pake_share);
  (this->session_id).size_ = '\0';
  std::unique_ptr<bssl::SSL_HANDSHAKE_HINTS,_bssl::internal::Deleter>::~unique_ptr(&this->hints);
  Array<unsigned_char>::~Array(&this->key_block);
  std::unique_ptr<bssl::ECHConfig,_bssl::internal::Deleter>::~unique_ptr(&this->selected_ech_config)
  ;
  std::unique_ptr<ssl_ech_keys_st,_bssl::internal::Deleter>::~unique_ptr(&this->ech_keys);
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&this->early_session);
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr(&this->new_session);
  std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr(&this->peer_pubkey);
  std::unique_ptr<ssl_credential_st,_bssl::internal::Deleter>::~unique_ptr(&this->credential);
  Array<unsigned_char>::~Array(&this->certificate_types);
  Array<unsigned_char>::~Array(&this->peer_available_trust_anchors);
  if ((this->peer_requested_trust_anchors).
      super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
      super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
      super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_engaged == true) {
    (this->peer_requested_trust_anchors).
    super__Optional_base<bssl::Array<unsigned_char>,_false,_false>._M_payload.
    super__Optional_payload<bssl::Array<unsigned_char>,_true,_false,_false>.
    super__Optional_payload_base<bssl::Array<unsigned_char>_>._M_engaged = false;
    Array<unsigned_char>::~Array((Array<unsigned_char> *)&this->peer_requested_trust_anchors);
  }
  std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr(&this->ca_names);
  std::unique_ptr<char,_bssl::internal::Deleter>::~unique_ptr(&this->peer_psk_identity_hint);
  Array<unsigned_char>::~Array(&this->server_params);
  EVP_HPKE_CTX_cleanup(&(this->ech_hpke_ctx).ctx_);
  Array<unsigned_char>::~Array(&this->extension_permutation);
  Array<unsigned_char>::~Array(&this->peer_key);
  Array<unsigned_short>::~Array(&this->peer_delegated_credential_sigalgs);
  Array<unsigned_short>::~Array(&this->peer_supported_group_list);
  Array<unsigned_short>::~Array(&this->peer_sigalgs);
  Array<unsigned_char>::~Array(&this->key_share_ciphertext);
  Array<unsigned_char>::~Array(&this->key_share_bytes);
  Array<unsigned_char>::~Array(&this->ech_client_hello_buf);
  Array<unsigned_char>::~Array(&this->ech_retry_configs);
  Array<unsigned_char>::~Array(&this->ech_client_outer);
  Array<unsigned_char>::~Array(&this->dtls_cookie);
  Array<unsigned_char>::~Array(&this->cookie);
  SSLTranscript::~SSLTranscript(&this->inner_transcript);
  SSLTranscript::~SSLTranscript(&this->transcript);
  lVar1 = 0;
  do {
    std::unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<bssl::SSLKeyShare,_bssl::internal::Deleter> *)
               ((long)&this->key_shares[1]._M_t.
                       super___uniq_ptr_impl<bssl::SSLKeyShare,_bssl::internal::Deleter>._M_t.
                       super__Tuple_impl<0UL,_bssl::SSLKeyShare_*,_bssl::internal::Deleter>.
                       super__Head_base<0UL,_bssl::SSLKeyShare_*,_false>._M_head_impl + lVar1));
    lVar1 = lVar1 + -8;
  } while (lVar1 != -0x10);
  std::unique_ptr<err_save_state_st,_bssl::internal::Deleter>::~unique_ptr(&this->error);
  (this->expected_client_finished).size_ = '\0';
  (this->server_traffic_secret_0).size_ = '\0';
  (this->client_traffic_secret_0).size_ = '\0';
  (this->server_handshake_secret).size_ = '\0';
  (this->client_handshake_secret).size_ = '\0';
  (this->early_traffic_secret).size_ = '\0';
  (this->secret).size_ = '\0';
  return;
}

Assistant:

SSL_HANDSHAKE::~SSL_HANDSHAKE() {
  ssl->ctx->x509_method->hs_flush_cached_ca_names(this);
}